

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O2

double __thiscall
BayesianGameIdenticalPayoff::ComputeValueJPol
          (BayesianGameIdenticalPayoff *this,JointPolicyDiscretePure *jpolBG)

{
  undefined1 auVar1 [16];
  uint uVar2;
  size_t sVar3;
  Index jtI;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  double local_30;
  
  auVar6 = ZEXT864(0) << 0x40;
  uVar4 = 0;
  local_30 = 0.0;
  while( true ) {
    sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)this);
    if (sVar3 <= uVar4) break;
    uVar2 = (*(jpolBG->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                      (jpolBG,(ulong)uVar4);
    (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this,(ulong)uVar4);
    uVar5 = auVar6._0_8_;
    (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this,(ulong)uVar4,(ulong)uVar2);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_30;
    uVar4 = uVar4 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    auVar1 = vfmadd231sd_fma(auVar7,auVar6._0_16_,auVar1);
    local_30 = auVar1._0_8_;
  }
  return local_30;
}

Assistant:

double BayesianGameIdenticalPayoff::ComputeValueJPol(const JointPolicyDiscretePure & jpolBG) const
{
    double v=0.0;
    for(Index jtI=0; jtI<GetNrJointTypes(); jtI++)
    {
        Index jaI = jpolBG.GetJointActionIndex(jtI);
        double p = GetProbability(jtI);
        double u = GetUtility(jtI, jaI);
        v += p*u;
    }
    return(v);

}